

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O1

void __thiscall
btQuantizedBvh::deSerializeFloat
          (btQuantizedBvh *this,btQuantizedBvhFloatData *quantizedBvhFloatData)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  btQuantizedBvhNode *ptr;
  btQuantizedBvhNodeData *pbVar6;
  btBvhSubtreeInfo *pbVar7;
  btBvhSubtreeInfoData *pbVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  int i;
  long lVar16;
  btOptimizedBvhNode *pbVar17;
  btOptimizedBvhNodeFloatData *pbVar18;
  btQuantizedBvhNode *pbVar19;
  btBvhSubtreeInfo *pbVar20;
  long lVar21;
  int *piVar22;
  int i_3;
  ulong uVar23;
  btOptimizedBvhNode *pbVar24;
  int i_4;
  
  lVar16 = 0;
  do {
    (this->m_bvhAabbMax).m_floats[lVar16] = (quantizedBvhFloatData->m_bvhAabbMax).m_floats[lVar16];
    lVar16 = lVar16 + 1;
  } while (lVar16 != 4);
  lVar16 = 0;
  do {
    (this->m_bvhAabbMin).m_floats[lVar16] = (quantizedBvhFloatData->m_bvhAabbMin).m_floats[lVar16];
    lVar16 = lVar16 + 1;
  } while (lVar16 != 4);
  lVar16 = 0;
  do {
    (this->m_bvhQuantization).m_floats[lVar16] =
         (quantizedBvhFloatData->m_bvhQuantization).m_floats[lVar16];
    lVar16 = lVar16 + 1;
  } while (lVar16 != 4);
  this->m_curNodeIndex = quantizedBvhFloatData->m_curNodeIndex;
  this->m_useQuantization = quantizedBvhFloatData->m_useQuantization != 0;
  uVar4 = quantizedBvhFloatData->m_numContiguousLeafNodes;
  iVar5 = (this->m_contiguousNodes).m_size;
  if ((iVar5 <= (int)uVar4) && (iVar5 < (int)uVar4)) {
    if ((this->m_contiguousNodes).m_capacity < (int)uVar4) {
      if (uVar4 == 0) {
        pbVar17 = (btOptimizedBvhNode *)0x0;
      }
      else {
        pbVar17 = (btOptimizedBvhNode *)btAlignedAllocInternal((long)(int)uVar4 << 6,0x10);
      }
      lVar16 = (long)(this->m_contiguousNodes).m_size;
      if (0 < lVar16) {
        lVar21 = 0;
        do {
          pbVar24 = (this->m_contiguousNodes).m_data;
          puVar1 = (undefined8 *)((long)(pbVar24->m_aabbMinOrg).m_floats + lVar21);
          uVar9 = *puVar1;
          uVar10 = puVar1[1];
          puVar1 = (undefined8 *)((long)(pbVar24->m_aabbMaxOrg).m_floats + lVar21);
          uVar11 = *puVar1;
          uVar12 = puVar1[1];
          uVar13 = *(undefined8 *)(pbVar24->m_padding + lVar21 + -0xc);
          uVar14 = *(undefined8 *)(pbVar24->m_padding + lVar21 + -0xc + 8);
          uVar15 = *(undefined8 *)(pbVar24->m_padding + lVar21 + 4 + 8);
          *(undefined8 *)(pbVar17->m_padding + lVar21 + 4) =
               *(undefined8 *)(pbVar24->m_padding + lVar21 + 4);
          *(undefined8 *)(pbVar17->m_padding + lVar21 + 4 + 8) = uVar15;
          *(undefined8 *)(pbVar17->m_padding + lVar21 + -0xc) = uVar13;
          *(undefined8 *)(pbVar17->m_padding + lVar21 + -0xc + 8) = uVar14;
          puVar1 = (undefined8 *)((long)(pbVar17->m_aabbMaxOrg).m_floats + lVar21);
          *puVar1 = uVar11;
          puVar1[1] = uVar12;
          puVar1 = (undefined8 *)((long)(pbVar17->m_aabbMinOrg).m_floats + lVar21);
          *puVar1 = uVar9;
          puVar1[1] = uVar10;
          lVar21 = lVar21 + 0x40;
        } while (lVar16 * 0x40 != lVar21);
      }
      pbVar24 = (this->m_contiguousNodes).m_data;
      if (pbVar24 != (btOptimizedBvhNode *)0x0) {
        if ((this->m_contiguousNodes).m_ownsMemory == true) {
          btAlignedFreeInternal(pbVar24);
        }
        (this->m_contiguousNodes).m_data = (btOptimizedBvhNode *)0x0;
      }
      (this->m_contiguousNodes).m_ownsMemory = true;
      (this->m_contiguousNodes).m_data = pbVar17;
      (this->m_contiguousNodes).m_capacity = uVar4;
    }
    if (iVar5 < (int)uVar4) {
      lVar16 = (long)(int)uVar4 - (long)iVar5;
      lVar21 = (long)iVar5 << 6;
      do {
        pbVar17 = (this->m_contiguousNodes).m_data;
        pcVar3 = pbVar17->m_padding + lVar21 + 4;
        pcVar3[0] = '\0';
        pcVar3[1] = '\0';
        pcVar3[2] = '\0';
        pcVar3[3] = '\0';
        pcVar3[4] = '\0';
        pcVar3[5] = '\0';
        pcVar3[6] = '\0';
        pcVar3[7] = '\0';
        pcVar3[8] = '\0';
        pcVar3[9] = '\0';
        pcVar3[10] = '\0';
        pcVar3[0xb] = '\0';
        pcVar3[0xc] = '\0';
        pcVar3[0xd] = '\0';
        pcVar3[0xe] = '\0';
        pcVar3[0xf] = '\0';
        pcVar3 = pbVar17->m_padding + lVar21 + -0xc;
        pcVar3[0] = '\0';
        pcVar3[1] = '\0';
        pcVar3[2] = '\0';
        pcVar3[3] = '\0';
        pcVar3[4] = '\0';
        pcVar3[5] = '\0';
        pcVar3[6] = '\0';
        pcVar3[7] = '\0';
        pcVar3[8] = '\0';
        pcVar3[9] = '\0';
        pcVar3[10] = '\0';
        pcVar3[0xb] = '\0';
        pcVar3[0xc] = '\0';
        pcVar3[0xd] = '\0';
        pcVar3[0xe] = '\0';
        pcVar3[0xf] = '\0';
        puVar1 = (undefined8 *)((long)(pbVar17->m_aabbMaxOrg).m_floats + lVar21);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)(pbVar17->m_aabbMinOrg).m_floats + lVar21);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar21 = lVar21 + 0x40;
        lVar16 = lVar16 + -1;
      } while (lVar16 != 0);
    }
  }
  (this->m_contiguousNodes).m_size = uVar4;
  if (0 < (int)uVar4) {
    pbVar18 = quantizedBvhFloatData->m_contiguousNodesPtr;
    pbVar17 = (this->m_contiguousNodes).m_data;
    uVar23 = 0;
    pbVar24 = pbVar17;
    do {
      lVar16 = 4;
      do {
        (pbVar24->m_aabbMinOrg).m_floats[lVar16] = (pbVar18->m_aabbMinOrg).m_floats[lVar16];
        lVar16 = lVar16 + 1;
      } while (lVar16 != 8);
      lVar16 = 0;
      do {
        (pbVar24->m_aabbMinOrg).m_floats[lVar16] = (pbVar18->m_aabbMinOrg).m_floats[lVar16];
        lVar16 = lVar16 + 1;
      } while (lVar16 != 4);
      iVar5 = pbVar18->m_subPart;
      pbVar17[uVar23].m_escapeIndex = pbVar18->m_escapeIndex;
      pbVar17[uVar23].m_subPart = iVar5;
      pbVar17[uVar23].m_triangleIndex = pbVar18->m_triangleIndex;
      uVar23 = uVar23 + 1;
      pbVar18 = pbVar18 + 1;
      pbVar24 = pbVar24 + 1;
    } while (uVar23 != uVar4);
  }
  uVar4 = quantizedBvhFloatData->m_numQuantizedContiguousNodes;
  iVar5 = (this->m_quantizedContiguousNodes).m_size;
  if ((iVar5 <= (int)uVar4) && (iVar5 < (int)uVar4)) {
    if ((this->m_quantizedContiguousNodes).m_capacity < (int)uVar4) {
      if (uVar4 == 0) {
        pbVar19 = (btQuantizedBvhNode *)0x0;
      }
      else {
        pbVar19 = (btQuantizedBvhNode *)btAlignedAllocInternal((long)(int)uVar4 << 4,0x10);
      }
      lVar16 = (long)(this->m_quantizedContiguousNodes).m_size;
      if (0 < lVar16) {
        lVar21 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((long)((this->m_quantizedContiguousNodes).m_data)->m_quantizedAabbMin + lVar21);
          uVar9 = puVar1[1];
          puVar2 = (undefined8 *)((long)pbVar19->m_quantizedAabbMin + lVar21);
          *puVar2 = *puVar1;
          puVar2[1] = uVar9;
          lVar21 = lVar21 + 0x10;
        } while (lVar16 * 0x10 != lVar21);
      }
      ptr = (this->m_quantizedContiguousNodes).m_data;
      if (ptr != (btQuantizedBvhNode *)0x0) {
        if ((this->m_quantizedContiguousNodes).m_ownsMemory == true) {
          btAlignedFreeInternal(ptr);
        }
        (this->m_quantizedContiguousNodes).m_data = (btQuantizedBvhNode *)0x0;
      }
      (this->m_quantizedContiguousNodes).m_ownsMemory = true;
      (this->m_quantizedContiguousNodes).m_data = pbVar19;
      (this->m_quantizedContiguousNodes).m_capacity = uVar4;
    }
    if (iVar5 < (int)uVar4) {
      lVar16 = (long)(int)uVar4 - (long)iVar5;
      lVar21 = (long)iVar5 << 4;
      do {
        puVar1 = (undefined8 *)
                 ((long)((this->m_quantizedContiguousNodes).m_data)->m_quantizedAabbMin + lVar21);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar21 = lVar21 + 0x10;
        lVar16 = lVar16 + -1;
      } while (lVar16 != 0);
    }
  }
  (this->m_quantizedContiguousNodes).m_size = uVar4;
  if (0 < (int)uVar4) {
    pbVar6 = quantizedBvhFloatData->m_quantizedContiguousNodesPtr;
    pbVar19 = (this->m_quantizedContiguousNodes).m_data;
    lVar16 = 0;
    do {
      *(undefined4 *)((long)pbVar19->m_quantizedAabbMax + lVar16 + 6) =
           *(undefined4 *)((long)pbVar6->m_quantizedAabbMax + lVar16 + 6);
      *(undefined2 *)((long)pbVar19->m_quantizedAabbMax + lVar16) =
           *(undefined2 *)((long)pbVar6->m_quantizedAabbMax + lVar16);
      *(undefined2 *)((long)pbVar19->m_quantizedAabbMax + lVar16 + 2) =
           *(undefined2 *)((long)pbVar6->m_quantizedAabbMax + lVar16 + 2);
      *(undefined2 *)((long)pbVar19->m_quantizedAabbMax + lVar16 + 4) =
           *(undefined2 *)((long)pbVar6->m_quantizedAabbMax + lVar16 + 4);
      *(undefined2 *)((long)pbVar19->m_quantizedAabbMin + lVar16) =
           *(undefined2 *)((long)pbVar6->m_quantizedAabbMin + lVar16);
      *(undefined2 *)((long)pbVar19->m_quantizedAabbMin + lVar16 + 2) =
           *(undefined2 *)((long)pbVar6->m_quantizedAabbMin + lVar16 + 2);
      *(undefined2 *)((long)pbVar19->m_quantizedAabbMin + lVar16 + 4) =
           *(undefined2 *)((long)pbVar6->m_quantizedAabbMin + lVar16 + 4);
      lVar16 = lVar16 + 0x10;
    } while ((ulong)uVar4 << 4 != lVar16);
  }
  this->m_traversalMode = quantizedBvhFloatData->m_traversalMode;
  uVar4 = quantizedBvhFloatData->m_numSubtreeHeaders;
  if (((this->m_SubtreeHeaders).m_size < (int)uVar4) &&
     ((this->m_SubtreeHeaders).m_capacity < (int)uVar4)) {
    if (uVar4 == 0) {
      pbVar20 = (btBvhSubtreeInfo *)0x0;
    }
    else {
      pbVar20 = (btBvhSubtreeInfo *)btAlignedAllocInternal((long)(int)uVar4 << 5,0x10);
    }
    lVar16 = (long)(this->m_SubtreeHeaders).m_size;
    if (0 < lVar16) {
      lVar21 = 0;
      do {
        pbVar7 = (this->m_SubtreeHeaders).m_data;
        puVar1 = (undefined8 *)((long)pbVar7->m_quantizedAabbMin + lVar21);
        uVar9 = *puVar1;
        uVar10 = puVar1[1];
        puVar1 = (undefined8 *)((long)pbVar7->m_padding + lVar21 + -4);
        uVar11 = puVar1[1];
        puVar2 = (undefined8 *)((long)pbVar20->m_padding + lVar21 + -4);
        *puVar2 = *puVar1;
        puVar2[1] = uVar11;
        puVar1 = (undefined8 *)((long)pbVar20->m_quantizedAabbMin + lVar21);
        *puVar1 = uVar9;
        puVar1[1] = uVar10;
        lVar21 = lVar21 + 0x20;
      } while (lVar16 * 0x20 != lVar21);
    }
    pbVar7 = (this->m_SubtreeHeaders).m_data;
    if (pbVar7 != (btBvhSubtreeInfo *)0x0) {
      if ((this->m_SubtreeHeaders).m_ownsMemory == true) {
        btAlignedFreeInternal(pbVar7);
      }
      (this->m_SubtreeHeaders).m_data = (btBvhSubtreeInfo *)0x0;
    }
    (this->m_SubtreeHeaders).m_ownsMemory = true;
    (this->m_SubtreeHeaders).m_data = pbVar20;
    (this->m_SubtreeHeaders).m_capacity = uVar4;
  }
  (this->m_SubtreeHeaders).m_size = uVar4;
  if (0 < (int)uVar4) {
    pbVar8 = quantizedBvhFloatData->m_subTreeInfoPtr;
    piVar22 = &((this->m_SubtreeHeaders).m_data)->m_rootNodeIndex;
    lVar16 = 0;
    do {
      *(unsigned_short *)((long)piVar22 + -6) =
           *(unsigned_short *)((long)pbVar8->m_quantizedAabbMax + lVar16);
      *(unsigned_short *)(piVar22 + -1) =
           *(unsigned_short *)((long)pbVar8->m_quantizedAabbMax + lVar16 + 2);
      *(unsigned_short *)((long)piVar22 + -2) =
           *(unsigned_short *)((long)pbVar8->m_quantizedAabbMax + lVar16 + 4);
      ((btBvhSubtreeInfo *)(piVar22 + -3))->m_quantizedAabbMin[0] =
           *(unsigned_short *)((long)pbVar8->m_quantizedAabbMin + lVar16);
      *(unsigned_short *)((long)piVar22 + -10) =
           *(unsigned_short *)((long)pbVar8->m_quantizedAabbMin + lVar16 + 2);
      *(unsigned_short *)(piVar22 + -2) =
           *(unsigned_short *)((long)pbVar8->m_quantizedAabbMin + lVar16 + 4);
      *(undefined8 *)piVar22 = *(undefined8 *)((long)pbVar8->m_quantizedAabbMin + lVar16 + -8);
      piVar22 = piVar22 + 8;
      lVar16 = lVar16 + 0x14;
    } while ((ulong)uVar4 * 0x14 != lVar16);
  }
  return;
}

Assistant:

void btQuantizedBvh::deSerializeFloat(struct btQuantizedBvhFloatData& quantizedBvhFloatData)
{
	m_bvhAabbMax.deSerializeFloat(quantizedBvhFloatData.m_bvhAabbMax);
	m_bvhAabbMin.deSerializeFloat(quantizedBvhFloatData.m_bvhAabbMin);
	m_bvhQuantization.deSerializeFloat(quantizedBvhFloatData.m_bvhQuantization);

	m_curNodeIndex = quantizedBvhFloatData.m_curNodeIndex;
	m_useQuantization = quantizedBvhFloatData.m_useQuantization!=0;
	
	{
		int numElem = quantizedBvhFloatData.m_numContiguousLeafNodes;
		m_contiguousNodes.resize(numElem);

		if (numElem)
		{
			btOptimizedBvhNodeFloatData* memPtr = quantizedBvhFloatData.m_contiguousNodesPtr;

			for (int i=0;i<numElem;i++,memPtr++)
			{
				m_contiguousNodes[i].m_aabbMaxOrg.deSerializeFloat(memPtr->m_aabbMaxOrg);
				m_contiguousNodes[i].m_aabbMinOrg.deSerializeFloat(memPtr->m_aabbMinOrg);
				m_contiguousNodes[i].m_escapeIndex = memPtr->m_escapeIndex;
				m_contiguousNodes[i].m_subPart = memPtr->m_subPart;
				m_contiguousNodes[i].m_triangleIndex = memPtr->m_triangleIndex;
			}
		}
	}

	{
		int numElem = quantizedBvhFloatData.m_numQuantizedContiguousNodes;
		m_quantizedContiguousNodes.resize(numElem);
		
		if (numElem)
		{
			btQuantizedBvhNodeData* memPtr = quantizedBvhFloatData.m_quantizedContiguousNodesPtr;
			for (int i=0;i<numElem;i++,memPtr++)
			{
				m_quantizedContiguousNodes[i].m_escapeIndexOrTriangleIndex = memPtr->m_escapeIndexOrTriangleIndex;
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[0] = memPtr->m_quantizedAabbMax[0];
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[1] = memPtr->m_quantizedAabbMax[1];
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[2] = memPtr->m_quantizedAabbMax[2];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[0] = memPtr->m_quantizedAabbMin[0];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[1] = memPtr->m_quantizedAabbMin[1];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[2] = memPtr->m_quantizedAabbMin[2];
			}
		}
	}

	m_traversalMode = btTraversalMode(quantizedBvhFloatData.m_traversalMode);
	
	{
		int numElem = quantizedBvhFloatData.m_numSubtreeHeaders;
		m_SubtreeHeaders.resize(numElem);
		if (numElem)
		{
			btBvhSubtreeInfoData* memPtr = quantizedBvhFloatData.m_subTreeInfoPtr;
			for (int i=0;i<numElem;i++,memPtr++)
			{
				m_SubtreeHeaders[i].m_quantizedAabbMax[0] = memPtr->m_quantizedAabbMax[0] ;
				m_SubtreeHeaders[i].m_quantizedAabbMax[1] = memPtr->m_quantizedAabbMax[1];
				m_SubtreeHeaders[i].m_quantizedAabbMax[2] = memPtr->m_quantizedAabbMax[2];
				m_SubtreeHeaders[i].m_quantizedAabbMin[0] = memPtr->m_quantizedAabbMin[0];
				m_SubtreeHeaders[i].m_quantizedAabbMin[1] = memPtr->m_quantizedAabbMin[1];
				m_SubtreeHeaders[i].m_quantizedAabbMin[2] = memPtr->m_quantizedAabbMin[2];
				m_SubtreeHeaders[i].m_rootNodeIndex = memPtr->m_rootNodeIndex;
				m_SubtreeHeaders[i].m_subtreeSize = memPtr->m_subtreeSize;
			}
		}
	}
}